

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_no_value.hpp
# Opt level: O3

void __thiscall
cfgfile::tag_no_value_t<cfgfile::string_trait_t>::on_string
          (tag_no_value_t<cfgfile::string_trait_t> *this,
          parser_info_t<cfgfile::string_trait_t> *info,string_t *str)

{
  size_type *psVar1;
  exception_t<cfgfile::string_trait_t> *this_00;
  long *plVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  pos_t pos;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  ulong *local_270;
  long local_268;
  ulong local_260 [2];
  ulong *local_250;
  long local_248;
  ulong local_240;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined1 *local_230;
  long local_228;
  undefined1 local_220 [16];
  undefined1 *local_210;
  long local_208;
  undefined1 local_200 [16];
  undefined1 *local_1f0;
  long local_1e8;
  undefined1 local_1e0 [16];
  undefined1 *local_1d0;
  long local_1c8;
  undefined1 local_1c0 [16];
  undefined1 *local_1b0;
  long local_1a8;
  undefined1 local_1a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  string_t local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
  local_230 = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"Tag \"","");
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char*>((string *)local_130,local_230,local_230 + local_228);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_130,
                              (ulong)(this->super_tag_t<cfgfile::string_trait_t>).m_name._M_dataplus
                                     ._M_p);
  local_250 = (ulong *)*plVar2;
  puVar4 = (ulong *)(plVar2 + 2);
  if (local_250 == puVar4) {
    local_240 = *puVar4;
    uStack_238 = (undefined4)plVar2[3];
    uStack_234 = *(undefined4 *)((long)plVar2 + 0x1c);
    local_250 = &local_240;
  }
  else {
    local_240 = *puVar4;
  }
  local_248 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b0,"\" doesn\'t allow any values. But we\'ve got this: \"","");
  local_270 = local_260;
  std::__cxx11::string::_M_construct<char*>((string *)&local_270,local_1b0,local_1b0 + local_1a8);
  uVar5 = 0xf;
  if (local_250 != &local_240) {
    uVar5 = local_240;
  }
  if (uVar5 < (ulong)(local_268 + local_248)) {
    uVar5 = 0xf;
    if (local_270 != local_260) {
      uVar5 = local_260[0];
    }
    if ((ulong)(local_268 + local_248) <= uVar5) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_250);
      goto LAB_001176ed;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_270);
LAB_001176ed:
  local_290._M_dataplus._M_p = (pointer)*puVar3;
  psVar1 = puVar3 + 2;
  if ((size_type *)local_290._M_dataplus._M_p == psVar1) {
    local_290.field_2._M_allocated_capacity = *psVar1;
    local_290.field_2._8_8_ = puVar3[3];
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
    local_290.field_2._M_allocated_capacity = *psVar1;
  }
  local_290._M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  std::operator+(&local_f0,&local_290,str);
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"\". In file \"","");
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_150,local_1d0,local_1d0 + local_1c8);
  std::operator+(&local_d0,&local_f0,&local_150);
  std::operator+(&local_b0,&local_d0,&info->m_file_name);
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"\" on line ","");
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_170,local_1f0,local_1f0 + local_1e8);
  std::operator+(&local_90,&local_b0,&local_170);
  string_trait_t::to_string_abi_cxx11_(&local_110,(string_trait_t *)info->m_line_number,pos);
  std::operator+(&local_70,&local_90,&local_110);
  local_210 = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,".","");
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_190,local_210,local_210 + local_208);
  std::operator+(&local_50,&local_70,&local_190);
  exception_t<cfgfile::string_trait_t>::exception_t(this_00,&local_50);
  __cxa_throw(this_00,&exception_t<cfgfile::string_trait_t>::typeinfo,
              exception_t<cfgfile::string_trait_t>::~exception_t);
}

Assistant:

void on_string( const parser_info_t< Trait > & info,
		const typename Trait::string_t & str ) override
	{
		throw exception_t< Trait >( Trait::from_ascii( "Tag \"" ) +
			this->name() + Trait::from_ascii( "\" doesn't allow any values. "
				"But we've got this: \"" ) +
			str + Trait::from_ascii( "\". In file \"" ) + info.file_name() +
			Trait::from_ascii( "\" on line " ) +
			Trait::to_string( info.line_number() ) +
			Trait::from_ascii( "." ) );
	}